

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

hugeint_t duckdb::GreatestCommonDivisor<duckdb::hugeint_t>(hugeint_t left,hugeint_t right)

{
  char cVar1;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t iVar2;
  TryAbsOperator *this;
  hugeint_t input;
  hugeint_t right_local;
  hugeint_t b;
  hugeint_t a;
  hugeint_t local_78;
  hugeint_t left_local;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  hugeint_t local_28;
  uint64_t uVar3;
  
  a.upper = left.upper;
  a.lower = left.lower;
  right_local.upper = right.upper;
  right_local.lower = right.lower;
  local_78.lower = 0;
  local_78.upper = -0x8000000000000000;
  b.lower = right_local.lower;
  b.upper = right_local.upper;
  left_local.lower = a.lower;
  left_local.upper = a.upper;
  cVar1 = duckdb::hugeint_t::operator==(&left_local,&local_78);
  if (cVar1 == '\0') {
LAB_007722c1:
    duckdb::hugeint_t::hugeint_t(&local_48,-1);
    cVar1 = duckdb::hugeint_t::operator==(&left_local,&local_48);
    if (cVar1 != '\0') {
      local_58.lower = 0;
      local_58.upper = -0x8000000000000000;
      cVar1 = duckdb::hugeint_t::operator==(&right_local,&local_58);
      if (cVar1 != '\0') goto LAB_007722fb;
    }
    while( true ) {
      duckdb::hugeint_t::hugeint_t(&local_78,0);
      cVar1 = duckdb::hugeint_t::operator==(&a,&local_78);
      iVar2 = extraout_RDX;
      uVar3 = b.upper;
      this = (TryAbsOperator *)b.lower;
      if (cVar1 != '\0') break;
      duckdb::hugeint_t::operator%=(&b,&a);
      duckdb::hugeint_t::hugeint_t(&local_78,0);
      cVar1 = duckdb::hugeint_t::operator==(&b,&local_78);
      iVar2 = extraout_RDX_00;
      uVar3 = a.upper;
      this = (TryAbsOperator *)a.lower;
      if (cVar1 != '\0') break;
      duckdb::hugeint_t::operator%=(&a,&b);
    }
    input.upper = iVar2;
    input.lower = uVar3;
    local_28 = TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(this,input);
  }
  else {
    duckdb::hugeint_t::hugeint_t(&local_38,-1);
    cVar1 = duckdb::hugeint_t::operator==(&right_local,&local_38);
    if (cVar1 == '\0') goto LAB_007722c1;
LAB_007722fb:
    duckdb::hugeint_t::hugeint_t(&local_28,1);
  }
  return local_28;
}

Assistant:

TA GreatestCommonDivisor(TA left, TA right) {
	TA a = left;
	TA b = right;

	// This protects the following modulo operations from a corner case,
	// where we would get a runtime error due to an integer overflow.
	if ((left == NumericLimits<TA>::Minimum() && right == -1) ||
	    (left == -1 && right == NumericLimits<TA>::Minimum())) {
		return 1;
	}

	while (true) {
		if (a == 0) {
			return TryAbsOperator::Operation<TA, TA>(b);
		}
		b %= a;

		if (b == 0) {
			return TryAbsOperator::Operation<TA, TA>(a);
		}
		a %= b;
	}
}